

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::DeleteProperty_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  Type *pTVar1;
  byte bVar2;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar3;
  RecyclableObject *value;
  code *pcVar4;
  bool bVar5;
  PropertyTypes PVar6;
  uint32 index;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  PropertyRecord *pPVar10;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  int i;
  undefined4 uStack_3c;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  _i = (undefined4 *)CONCAT44(uStack_3c,propertyOperationFlags);
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x406,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) goto LAB_00da54bf;
    *puVar9 = 0;
  }
  local_50 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_50,&local_38,(int *)&propertyRecord);
  if (bVar5) {
    PVar6 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    if (((-1 < (char)PVar6) &&
        (bVar5 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId), bVar5)) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      pJVar3 = (this_00->super_ScriptContextBase).javascriptLibrary;
      Memory::Recycler::WBSetBit((char *)&propertyRecord);
      propertyRecord = (PropertyRecord *)&pJVar3->typesWithNoSpecialPropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyRecord);
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyRecord);
    }
    if (((local_38->flags & (UsedAsFixed|IsFixed)) != None) &&
       (((local_38->Attributes & 8) != 0 ||
        (((local_38->Data == -1 && (local_38->Getter == -1)) && (local_38->Setter == -1)))))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x413,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar5) goto LAB_00da54bf;
      *puVar9 = 0;
    }
    bVar2 = local_38->Attributes;
    if ((bVar2 & 8) != 0) {
      return 1;
    }
    if ((bVar2 & 2) == 0) {
      pPVar10 = ScriptContext::GetPropertyName(this_00,propertyId);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(i,this_00,(PCWSTR)(pPVar10 + 1))
      ;
      return 0;
    }
    value = (((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
    if (((bVar2 & 0x10) != 0) && ((local_38->flags & IsShadowed) == None)) {
      return 0;
    }
    iVar8 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(local_38);
    if (iVar8 == -1) {
      if ((local_38->flags & IsAccessor) == None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        _i = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *_i = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x439,"(descriptor->GetIsAccessor())",
                                    "descriptor->GetIsAccessor()");
        if (!bVar5) goto LAB_00da54bf;
        *_i = 0;
      }
      iVar8 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(local_38);
      DynamicTypeHandler::SetSlotUnchecked(instance,iVar8,value);
      iVar8 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(local_38);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,iVar8,value);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    }
    if ((local_38->Attributes & 0x10) == 0) {
      if ((local_38->flags & IsShadowed) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x445,"(!descriptor->GetIsShadowed())",
                                    "!descriptor->GetIsShadowed()");
        if (!bVar5) {
LAB_00da54bf:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      local_38->Attributes = '\x0e';
    }
    else {
      local_38->Attributes = local_38->Attributes & 0xf0 | 0xe;
    }
    InvalidateFixedField<int>(this,instance,propertyId,local_38);
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
    BVar7 = 1;
  }
  else {
    bVar5 = DynamicObject::HasObjectArray(instance);
    BVar7 = 1;
    if ((bVar5) && (local_50->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_50);
      BVar7 = DynamicTypeHandler::DeleteItem(&this->super_DynamicTypeHandler,instance,index,i);
    }
  }
  return BVar7;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                // If PropertyDeleted and PropertyLetConstGlobal are set then we have both
                // a deleted global property and let/const variable in this descriptor.
                // If allowLetConstGlobal is true then the let/const shadows the property
                // and we should return false for a failed delete by going into the else
                // if branch below.
                if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
                {
                    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable) ||
                (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(propertyId);
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyId, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
        }

        return true;
    }